

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractproxymodel.cpp
# Opt level: O0

void __thiscall
QAbstractProxyModelPrivate::_q_sourceModelColumnsAboutToBeInserted
          (QAbstractProxyModelPrivate *this,QModelIndex *parent,int param_3,int param_4)

{
  QAbstractItemModel *pQVar1;
  bool bVar2;
  int iVar3;
  arrow_operator_result ppQVar4;
  QModelIndex *in_RDI;
  long in_FS_OFFSET;
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QModelIndex::isValid(in_RDI);
  if (!bVar2) {
    ppQVar4 = QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
              ::operator->((QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
                            *)in_RDI);
    pQVar1 = *ppQVar4;
    QModelIndex::QModelIndex((QModelIndex *)0x8522c6);
    iVar3 = (*(pQVar1->super_QObject)._vptr_QObject[0x10])(pQVar1,local_20);
    *(byte *)&in_RDI[9].i = (byte)in_RDI[9].i & 0xfd | (iVar3 == 0) << 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractProxyModelPrivate::_q_sourceModelColumnsAboutToBeInserted(const QModelIndex &parent, int, int)
{
    if (parent.isValid())
        return;
    sourceHadZeroColumns = model->columnCount() == 0;
}